

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O3

int nn_pipe_send(nn_pipe *self,nn_msg *msg)

{
  uint uVar1;
  uint extraout_EAX;
  uint in_ECX;
  nn_pipe *unaff_RBX;
  
  if (self[0x62] == (nn_pipe)0x1) {
    self[0x62] = (nn_pipe)0x2;
    uVar1 = (*(code *)**(undefined8 **)(self + 0x58))();
    unaff_RBX = self;
    if (-1 < (int)uVar1) {
      in_ECX = (uint)(byte)self[0x62];
      if (self[0x62] == (nn_pipe)0x3) {
        self[0x62] = (nn_pipe)0x1;
        return uVar1;
      }
      goto LAB_001a22e0;
    }
  }
  else {
    nn_pipe_send_cold_1();
  }
  nn_pipe_send_cold_3();
  uVar1 = extraout_EAX;
LAB_001a22e0:
  if (in_ECX == 2) {
    unaff_RBX[0x62] = (nn_pipe)0x4;
    return uVar1 | 1;
  }
  nn_pipe_send_cold_2();
}

Assistant:

int nn_pipe_send (struct nn_pipe *self, struct nn_msg *msg)
{
    int rc;
    struct nn_pipebase *pipebase;

    pipebase = (struct nn_pipebase*) self;
    nn_assert (pipebase->outstate == NN_PIPEBASE_OUTSTATE_IDLE);
    pipebase->outstate = NN_PIPEBASE_OUTSTATE_SENDING;
    rc = pipebase->vfptr->send (pipebase, msg);
    errnum_assert (rc >= 0, -rc);
    if (nn_fast (pipebase->outstate == NN_PIPEBASE_OUTSTATE_SENT)) {
        pipebase->outstate = NN_PIPEBASE_OUTSTATE_IDLE;
        return rc;
    }
    nn_assert (pipebase->outstate == NN_PIPEBASE_OUTSTATE_SENDING);
    pipebase->outstate = NN_PIPEBASE_OUTSTATE_ASYNC;
    return rc | NN_PIPEBASE_RELEASE;
}